

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-str_utils.c
# Opt level: O3

void CGTFS_StrUtils(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  iVar1 = greatest_test_pre("str_utils_filename_no_ext");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 != 0) goto LAB_00124580;
  pcVar3 = get_filename_no_ext("hello",'/');
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = greatest_do_assert_equal_t("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
  if (iVar1 == 0) {
    greatest_info.fail_line = 0xc;
    if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00124564;
LAB_00124535:
    greatest_info.msg = "\"hello\" != got";
  }
  else {
    free(pcVar3);
    pcVar3 = get_filename_no_ext("hello.there",'/');
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = greatest_do_assert_equal_t("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
    if (iVar1 == 0) {
      greatest_info.fail_line = 0x10;
joined_r0x0012443c:
      if (greatest_type_info_string.equal != (greatest_equal_cb *)0x0) goto LAB_00124535;
LAB_00124564:
      greatest_info.msg = "type_info->equal callback missing!";
    }
    else {
      free(pcVar3);
      pcVar3 = get_filename_no_ext("/path/to/hello.there",'/');
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x14;
        goto joined_r0x0012443c;
      }
      free(pcVar3);
      pcVar3 = get_filename_no_ext("/pa.th/to/hello",'/');
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x18;
        goto joined_r0x0012443c;
      }
      free(pcVar3);
      pcVar3 = get_filename_no_ext("/pa.th/to/hello.there",'/');
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x1c;
        goto joined_r0x0012443c;
      }
      free(pcVar3);
      pcVar3 = get_filename_no_ext("/pa.th/to/hello.the.re",'/');
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("hello.the",pcVar3,&greatest_type_info_string,(void *)0x0);
      if (iVar1 != 0) {
        free(pcVar3);
        pcVar3 = get_filename_no_ext("hello",'\\');
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x26;
        }
        else {
          free(pcVar3);
          pcVar3 = get_filename_no_ext("hello.there",'\\');
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x2a;
          }
          else {
            free(pcVar3);
            pcVar3 = get_filename_no_ext("C:\\path\\to\\hello.there",'\\');
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = greatest_do_assert_equal_t
                              ("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
            if (iVar1 == 0) {
              greatest_info.fail_line = 0x2e;
            }
            else {
              free(pcVar3);
              pcVar3 = get_filename_no_ext("D:\\pa.th\\to\\hello",'\\');
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = greatest_do_assert_equal_t
                                ("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
              if (iVar1 == 0) {
                greatest_info.fail_line = 0x32;
              }
              else {
                free(pcVar3);
                pcVar3 = get_filename_no_ext("E:\\pa.th\\to\\hello.there",'\\');
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar1 = greatest_do_assert_equal_t
                                  ("hello",pcVar3,&greatest_type_info_string,(void *)0x0);
                if (iVar1 != 0) {
                  free(pcVar3);
                  pcVar3 = get_filename_no_ext("F:\\pa.th\\to\\hello.the.re",'\\');
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar1 = 0;
                  iVar2 = greatest_do_assert_equal_t
                                    ("hello.the",pcVar3,&greatest_type_info_string,(void *)0x0);
                  if (iVar2 != 0) {
                    free(pcVar3);
                    greatest_info.msg = (char *)0x0;
                    goto LAB_00124580;
                  }
                  greatest_info.fail_line = 0x3a;
                  goto joined_r0x00124467;
                }
                greatest_info.fail_line = 0x36;
              }
            }
          }
        }
        goto joined_r0x0012443c;
      }
      greatest_info.fail_line = 0x20;
joined_r0x00124467:
      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00124564;
      greatest_info.msg = "\"hello.the\" != got";
    }
  }
  greatest_info.fail_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-str_utils.c"
  ;
  iVar1 = -1;
  if ((greatest_info.flags & 4) != 0) {
    abort();
  }
LAB_00124580:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_StrUtils) {
    RUN_TEST(str_utils_filename_no_ext);
}